

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O0

void __thiscall Ptex::v2_2::PtexSeparableKernel::downresV(PtexSeparableKernel *this)

{
  int i;
  float *dst;
  float *src;
  PtexSeparableKernel *this_local;
  
  src = this->kv;
  dst = this->kv;
  if ((this->v & 1U) != 0) {
    dst = dst + 1;
    src = src + 1;
    this->vw = this->vw + -1;
  }
  for (i = this->vw / 2; 0 < i; i = i + -1) {
    *dst = *src + src[1];
    src = src + 2;
    dst = dst + 1;
  }
  if ((this->vw & 1U) != 0) {
    *dst = *src;
    dst = dst + 1;
  }
  this->v = this->v / 2;
  this->vw = (int)((long)dst - (long)this->kv >> 2);
  (this->res).vlog2 = (this->res).vlog2 + -1;
  return;
}

Assistant:

void downresV()
    {
        float* src = kv;
        float* dst = kv;

        // skip odd leading sample (if any)
        if (v & 1) {
            dst++;
            src++;
            vw--;
        }

        // combine even pairs
        for (int i = vw/2; i > 0; i--) {
            *dst++ = src[0] + src[1];
            src += 2;
        }

        // copy odd trailing sample (if any)
        if (vw & 1) {
            *dst++ = *src++;
        }

        // update state
        v /= 2;
        vw = int(dst - kv);
        res.vlog2--;
    }